

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

int fast_mp_montgomery_reduce(mp_int *x,mp_int *n,mp_digit rho)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  int iVar3;
  ulong uVar4;
  long lVar5;
  long in_RDX;
  mp_int *in_RSI;
  mp_int *in_RDI;
  ulong uVar6;
  mp_word *_W1;
  mp_word *_W_2;
  mp_digit *tmpx_1;
  mp_word *_W_1;
  mp_digit *tmpn;
  int iy;
  mp_digit mu;
  mp_digit *tmpx;
  mp_word *_W;
  mp_word W [512];
  int olduse;
  int res;
  int ix;
  undefined8 in_stack_ffffffffffffdf80;
  ulong *puVar7;
  mp_int *in_stack_ffffffffffffdf88;
  ulong *puVar8;
  ulong *local_2070;
  ulong *local_2068;
  ulong *local_2060;
  undefined4 in_stack_ffffffffffffdfa8;
  int in_stack_ffffffffffffdfac;
  mp_int *in_stack_ffffffffffffdfb0;
  mp_int *a;
  ulong *local_2040;
  ulong local_2038 [1025];
  int local_2c;
  undefined4 local_28;
  int local_24;
  long local_20;
  mp_int *local_18;
  mp_int *local_10;
  int local_4;
  
  local_2c = in_RDI->used;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (in_RDI->alloc < in_RSI->used + 1) {
    iVar3 = mp_grow(in_stack_ffffffffffffdf88,(int)((ulong)in_stack_ffffffffffffdf80 >> 0x20));
    if (iVar3 != 0) {
      return iVar3;
    }
    local_28 = 0;
  }
  a = (mp_int *)local_10->dp;
  local_2040 = local_2038;
  for (local_24 = 0; local_24 < local_10->used; local_24 = local_24 + 1) {
    *local_2040 = *(ulong *)a;
    local_2040[1] = 0;
    a = (mp_int *)&a->sign;
    local_2040 = local_2040 + 2;
  }
  for (; local_24 < local_18->used * 2 + 1; local_24 = local_24 + 1) {
    local_2040[1] = 0;
    *local_2040 = 0;
    local_2040 = local_2040 + 2;
  }
  for (local_24 = 0; local_24 < local_18->used; local_24 = local_24 + 1) {
    in_stack_ffffffffffffdfb0 =
         (mp_int *)(local_2038[(long)local_24 * 2] * local_20 & 0xfffffffffffffff);
    local_2068 = local_2038 + (long)local_24 * 2;
    local_2060 = local_18->dp;
    for (in_stack_ffffffffffffdfac = 0; in_stack_ffffffffffffdfac < local_18->used;
        in_stack_ffffffffffffdfac = in_stack_ffffffffffffdfac + 1) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = in_stack_ffffffffffffdfb0;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *local_2060;
      uVar4 = SUB168(auVar1 * auVar2,0);
      local_2068[1] = local_2068[1] + SUB168(auVar1 * auVar2,8) + (ulong)CARRY8(*local_2068,uVar4);
      *local_2068 = *local_2068 + uVar4;
      local_2068 = local_2068 + 2;
      local_2060 = local_2060 + 1;
    }
    lVar5 = (long)local_24;
    uVar6 = local_2038[lVar5 * 2 + 1] << 4 | local_2038[lVar5 * 2] >> 0x3c;
    uVar4 = local_2038[lVar5 * 2 + 2];
    local_2038[lVar5 * 2 + 2] = uVar4 + uVar6;
    local_2038[lVar5 * 2 + 3] =
         local_2038[lVar5 * 2 + 3] + (local_2038[lVar5 * 2 + 1] >> 0x3c) +
         (ulong)CARRY8(uVar4,uVar6);
  }
  lVar5 = (long)local_24;
  local_24 = local_24 + 1;
  puVar7 = local_2038 + lVar5 * 2;
  puVar8 = local_2038 + (long)local_24 * 2;
  for (; local_24 <= local_18->used * 2 + 1; local_24 = local_24 + 1) {
    uVar4 = puVar7[1] << 4 | *puVar7 >> 0x3c;
    puVar8[1] = puVar8[1] + (puVar7[1] >> 0x3c) + (ulong)CARRY8(*puVar8,uVar4);
    *puVar8 = *puVar8 + uVar4;
    puVar7 = puVar7 + 2;
    puVar8 = puVar8 + 2;
  }
  puVar7 = local_2038 + (long)local_18->used * 2;
  local_2070 = local_10->dp;
  for (local_24 = 0; local_24 < local_18->used + 1; local_24 = local_24 + 1) {
    *local_2070 = *puVar7 & 0xfffffffffffffff;
    puVar7 = puVar7 + 2;
    local_2070 = local_2070 + 1;
  }
  for (; local_24 < local_2c; local_24 = local_24 + 1) {
    *local_2070 = 0;
    local_2070 = local_2070 + 1;
  }
  local_10->used = local_18->used + 1;
  mp_clamp(local_10);
  iVar3 = mp_cmp_mag(local_10,local_18);
  if (iVar3 == -1) {
    local_4 = 0;
  }
  else {
    local_4 = s_mp_sub(a,in_stack_ffffffffffffdfb0,
                       (mp_int *)CONCAT44(in_stack_ffffffffffffdfac,in_stack_ffffffffffffdfa8));
  }
  return local_4;
}

Assistant:

int fast_mp_montgomery_reduce (mp_int * x, mp_int * n, mp_digit rho)
{
  int     ix, res, olduse;
  mp_word W[MP_WARRAY];

  /* get old used count */
  olduse = x->used;

  /* grow a as required */
  if (x->alloc < n->used + 1) {
    if ((res = mp_grow (x, n->used + 1)) != MP_OKAY) {
      return res;
    }
  }

  /* first we have to get the digits of the input into
   * an array of double precision words W[...]
   */
  {
    register mp_word *_W;
    register mp_digit *tmpx;

    /* alias for the W[] array */
    _W   = W;

    /* alias for the digits of  x*/
    tmpx = x->dp;

    /* copy the digits of a into W[0..a->used-1] */
    for (ix = 0; ix < x->used; ix++) {
      *_W++ = *tmpx++;
    }

    /* zero the high words of W[a->used..m->used*2] */
    for (; ix < n->used * 2 + 1; ix++) {
      *_W++ = 0;
    }
  }

  /* now we proceed to zero successive digits
   * from the least significant upwards
   */
  for (ix = 0; ix < n->used; ix++) {
    /* mu = ai * m' mod b
     *
     * We avoid a double precision multiplication (which isn't required)
     * by casting the value down to a mp_digit.  Note this requires
     * that W[ix-1] have  the carry cleared (see after the inner loop)
     */
    register mp_digit mu;
    mu = (mp_digit) (((W[ix] & MP_MASK) * rho) & MP_MASK);

    /* a = a + mu * m * b**i
     *
     * This is computed in place and on the fly.  The multiplication
     * by b**i is handled by offseting which columns the results
     * are added to.
     *
     * Note the comba method normally doesn't handle carries in the
     * inner loop In this case we fix the carry from the previous
     * column since the Montgomery reduction requires digits of the
     * result (so far) [see above] to work.  This is
     * handled by fixing up one carry after the inner loop.  The
     * carry fixups are done in order so after these loops the
     * first m->used words of W[] have the carries fixed
     */
    {
      register int iy;
      register mp_digit *tmpn;
      register mp_word *_W;

      /* alias for the digits of the modulus */
      tmpn = n->dp;

      /* Alias for the columns set by an offset of ix */
      _W = W + ix;

      /* inner loop */
      for (iy = 0; iy < n->used; iy++) {
          *_W++ += ((mp_word)mu) * ((mp_word)*tmpn++);
      }
    }

    /* now fix carry for next digit, W[ix+1] */
    W[ix + 1] += W[ix] >> ((mp_word) DIGIT_BIT);
  }

  /* now we have to propagate the carries and
   * shift the words downward [all those least
   * significant digits we zeroed].
   */
  {
    register mp_digit *tmpx;
    register mp_word *_W, *_W1;

    /* nox fix rest of carries */

    /* alias for current word */
    _W1 = W + ix;

    /* alias for next word, where the carry goes */
    _W = W + ++ix;

    for (; ix <= n->used * 2 + 1; ix++) {
      *_W++ += *_W1++ >> ((mp_word) DIGIT_BIT);
    }

    /* copy out, A = A/b**n
     *
     * The result is A/b**n but instead of converting from an
     * array of mp_word to mp_digit than calling mp_rshd
     * we just copy them in the right order
     */

    /* alias for destination word */
    tmpx = x->dp;

    /* alias for shifted double precision result */
    _W = W + n->used;

    for (ix = 0; ix < n->used + 1; ix++) {
      *tmpx++ = (mp_digit)(*_W++ & ((mp_word) MP_MASK));
    }

    /* zero oldused digits, if the input a was larger than
     * m->used+1 we'll have to clear the digits
     */
    for (; ix < olduse; ix++) {
      *tmpx++ = 0;
    }
  }

  /* set the max used and clamp */
  x->used = n->used + 1;
  mp_clamp (x);

  /* if A >= m then A = A - m */
  if (mp_cmp_mag (x, n) != MP_LT) {
    return s_mp_sub (x, n, x);
  }
  return MP_OKAY;
}